

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_read_data(mtar_t *tar,void *ptr,size_t size)

{
  int iVar1;
  undefined1 local_110 [8];
  mtar_header_t h;
  int err;
  size_t size_local;
  void *ptr_local;
  mtar_t *tar_local;
  
  if (tar->remaining_data == 0) {
    h.linkname._96_4_ = mtar_read_header(tar,(mtar_header_t *)local_110);
    if (h.linkname._96_4_ != 0) {
      return h.linkname._96_4_;
    }
    iVar1 = mtar_seek(tar,tar->pos + 0x200);
    if (iVar1 != 0) {
      return iVar1;
    }
    tar->remaining_data = h._0_8_;
    h.linkname[0x60] = '\0';
    h.linkname[0x61] = '\0';
    h.linkname[0x62] = '\0';
    h.linkname[99] = '\0';
  }
  h.linkname._96_4_ = mtar_tread(tar,ptr,size);
  tar_local._4_4_ = h.linkname._96_4_;
  if (h.linkname._96_4_ == 0) {
    tar->remaining_data = tar->remaining_data - size;
    if (tar->remaining_data == 0) {
      tar_local._4_4_ = mtar_seek(tar,tar->last_header);
    }
    else {
      tar_local._4_4_ = 0;
    }
  }
  return tar_local._4_4_;
}

Assistant:

int mtar_read_data(mtar_t *tar, void *ptr, size_t size) {
  int err;
  mtar_header_t h;
  /* If we have no remaining data then this is the first read, we get the size,
   * set the remaining data and seek to the beginning of the data */
  if (tar->remaining_data == 0) {
    /* Read header */
    err = mtar_read_header(tar, &h);
    if (err) {
      return err;
    }
    /* Seek past header and init remaining data */
    err = mtar_seek(tar, tar->pos + sizeof(mtar_raw_header_t));
    if (err) {
      return err;
    }
    tar->remaining_data = h.size;
  }
  /* Read data */
  err = mtar_tread(tar, ptr, size);
  if (err) {
    return err;
  }
  tar->remaining_data -= size;
  /* If there is no remaining data we've finished reading and seek back to the
   * header */
  if (tar->remaining_data == 0) {
    return mtar_seek(tar, tar->last_header);
  }
  return MTAR_ESUCCESS;
}